

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ES2Checker::check
          (ES2Checker *this,GLenum attPoint,Attachment *att,Image *image)

{
  RenderContext *ctx;
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  if (this->m_width == -1) {
    this->m_width = image->width;
    this->m_height = image->height;
  }
  else if ((image->width != this->m_width) || (image->height != this->m_height)) {
    ctx = (this->super_Checker).m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"DEQP_gles3_core_compatible",&local_41);
    bVar1 = deqp::gls::FboUtil::checkExtensionSupport(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (!bVar1) {
      deqp::gls::FboUtil::Checker::addFBOStatus
                (&this->super_Checker,0x8cd9,"Sizes of attachments differ");
    }
  }
  deqp::gls::FboUtil::Checker::addPotentialFBOStatus
            (&this->super_Checker,0x8cdd,"Particular format combinations need not to be supported");
  return;
}

Assistant:

void ES2Checker::check (GLenum attPoint, const Attachment& att, const Image* image)
{
	DE_UNREF(attPoint);
	DE_UNREF(att);
	// GLES2: "All attached images have the same width and height."
	if (m_width == -1)
	{
		m_width = image->width;
		m_height = image->height;
	}
	else if (image->width != m_width || image->height != m_height)
	{
		// Since GLES3 is "backwards compatible" to GLES2, we might actually be running
		// on a GLES3 context. On GLES3, FRAMEBUFFER_INCOMPLETE_DIMENSIONS is not generated
		// if attachments have different sizes.
		if (!gls::FboUtil::checkExtensionSupport(m_renderCtx, "DEQP_gles3_core_compatible"))
		{
			// running on GLES2
			addFBOStatus(GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS, "Sizes of attachments differ");
		}
	}
	// GLES2, 4.4.5: "some implementations may not support rendering to
	// particular combinations of internal formats. If the combination of
	// formats of the images attached to a framebuffer object are not
	// supported by the implementation, then the framebuffer is not complete
	// under the clause labeled FRAMEBUFFER_UNSUPPORTED."
	//
	// Hence it is _always_ allowed to report FRAMEBUFFER_UNSUPPORTED.
	addPotentialFBOStatus(GL_FRAMEBUFFER_UNSUPPORTED, "Particular format combinations need not to be supported");
}